

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ExpressionNode::ExpressionNode
          (ExpressionNode *this,Location *loc,shared_ptr<minja::Expression> *e)

{
  TemplateNode *in_RDI;
  Location *in_stack_ffffffffffffffd8;
  
  TemplateNode::TemplateNode(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI->_vptr_TemplateNode = (_func_int **)&PTR_do_render_00423630;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

ExpressionNode(const Location & loc, std::shared_ptr<Expression> && e) : TemplateNode(loc), expr(std::move(e)) {}